

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall QUrl::setQuery(QUrl *this,QUrlQuery *query)

{
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QUrl *)in_RDI);
  QUrlPrivate::clearError((QUrlPrivate *)0x2fc77c);
  pQVar4 = in_RSI;
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)in_RDI,
             (ComponentFormattingOption)((ulong)in_RSI >> 0x20));
  QUrlQuery::toString((QUrlQuery *)in_RSI,
                      (QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>)
                      SUB84((ulong)pQVar4 >> 0x20,0));
  QString::operator=(in_RDI,in_RSI);
  QString::~QString((QString *)0x2fc7c6);
  bVar3 = QUrlQuery::isEmpty((QUrlQuery *)in_RDI);
  if (bVar3) {
    pDVar2 = (in_RDI->d).d;
    *(byte *)&pDVar2[0xb].super_QArrayData.alloc = (byte)pDVar2[0xb].super_QArrayData.alloc & 0xbf;
  }
  else {
    pDVar2 = (in_RDI->d).d;
    *(byte *)&pDVar2[0xb].super_QArrayData.alloc = (byte)pDVar2[0xb].super_QArrayData.alloc | 0x40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setQuery(const QUrlQuery &query)
{
    detach();
    d->clearError();

    // we know the data is in the right format
    d->query = query.toString();
    if (query.isEmpty())
        d->sectionIsPresent &= ~QUrlPrivate::Query;
    else
        d->sectionIsPresent |= QUrlPrivate::Query;
}